

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O0

void __thiscall
NJamSpell::TBloomFilter::TBloomFilter(TBloomFilter *this,uint64_t elements,double falsePositiveRate)

{
  bool bVar1;
  Impl *this_00;
  undefined1 local_68 [8];
  bloom_parameters parameters;
  double falsePositiveRate_local;
  uint64_t elements_local;
  TBloomFilter *this_local;
  
  parameters.optimal_parameters.table_size = (unsigned_long_long)falsePositiveRate;
  std::unique_ptr<NJamSpell::TBloomFilter::Impl,std::default_delete<NJamSpell::TBloomFilter::Impl>>
  ::unique_ptr<std::default_delete<NJamSpell::TBloomFilter::Impl>,void>
            ((unique_ptr<NJamSpell::TBloomFilter::Impl,std::default_delete<NJamSpell::TBloomFilter::Impl>>
              *)this);
  bloom_parameters::bloom_parameters((bloom_parameters *)local_68);
  parameters.projected_element_count = parameters.optimal_parameters.table_size;
  parameters.false_positive_probability = 2.07507571253324e-322;
  parameters._24_8_ = elements;
  bloom_parameters::compute_optimal_parameters((bloom_parameters *)local_68);
  bVar1 = bloom_parameters::operator!((bloom_parameters *)local_68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(!parameters)",
                  "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/bloom_filter.cpp"
                  ,0x25,"NJamSpell::TBloomFilter::TBloomFilter(uint64_t, double)");
  }
  this_00 = (Impl *)operator_new(0x68);
  Impl::Impl(this_00,(bloom_parameters *)local_68);
  std::
  unique_ptr<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>::
  reset(&this->BloomFilter,this_00);
  bloom_parameters::~bloom_parameters((bloom_parameters *)local_68);
  return;
}

Assistant:

TBloomFilter::TBloomFilter(uint64_t elements, double falsePositiveRate) {
    bloom_parameters parameters;
    parameters.projected_element_count = elements;
    parameters.false_positive_probability = falsePositiveRate;
    parameters.random_seed = 42;
    parameters.compute_optimal_parameters();
    assert(!(!parameters));
    BloomFilter.reset(new TBloomFilter::Impl(parameters));
}